

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::continue_statement::print(continue_statement *this,wostream *os)

{
  ulong uVar1;
  wostream *os_local;
  continue_statement *this_local;
  
  std::operator<<(os,"continue_statement{");
  uVar1 = std::__cxx11::wstring::empty();
  if ((uVar1 & 1) == 0) {
    std::operator<<(os,(wstring *)&this->id_);
  }
  std::operator<<(os,"}");
  return;
}

Assistant:

void print(std::wostream& os) const override {
        os << "continue_statement{";
        if (!id_.empty()) {
            os << id_;
        }
        os << "}";
    }